

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O2

_Bool chirc_ctx_get_or_create_channel(chirc_ctx_t *ctx,char *channelname,chirc_channel_t **channel)

{
  UT_hash_bucket *pUVar1;
  UT_hash_handle *pUVar2;
  UT_hash_handle *pUVar3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  sds pcVar7;
  size_t sVar8;
  UT_hash_table *pUVar9;
  UT_hash_bucket *pUVar10;
  ulong uVar11;
  uint uVar12;
  UT_hash_handle *pUVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  chirc_channel_t *pcVar20;
  
  sVar5 = strlen(channelname);
  *channel = (chirc_channel_t *)0x0;
  if (ctx->channels != (chirc_channel_t *)0x0) {
    pbVar6 = (byte *)(channelname + 10);
    uVar12 = 0xfeedbeef;
    uVar14 = 0x9e3779b9;
    uVar17 = 0x9e3779b9;
    uVar16 = sVar5 & 0xffffffff;
    while (uVar15 = (uint)uVar16, 0xb < uVar15) {
      uVar12 = uVar12 + *(int *)(pbVar6 + -2);
      uVar17 = uVar12 >> 0xd ^
               ((uVar17 + *(int *)(pbVar6 + -10)) - (uVar14 + *(int *)(pbVar6 + -6))) - uVar12;
      uVar14 = uVar17 << 8 ^ ((uVar14 + *(int *)(pbVar6 + -6)) - uVar12) - uVar17;
      uVar12 = uVar14 >> 0xd ^ (uVar12 - uVar17) - uVar14;
      uVar17 = uVar12 >> 0xc ^ (uVar17 - uVar14) - uVar12;
      uVar14 = uVar17 << 0x10 ^ (uVar14 - uVar12) - uVar17;
      uVar12 = uVar14 >> 5 ^ (uVar12 - uVar17) - uVar14;
      uVar17 = uVar12 >> 3 ^ (uVar17 - uVar14) - uVar12;
      uVar14 = uVar17 << 10 ^ (uVar14 - uVar12) - uVar17;
      uVar12 = uVar14 >> 0xf ^ (uVar12 - uVar17) - uVar14;
      pbVar6 = pbVar6 + 0xc;
      uVar16 = (ulong)(uVar15 - 0xc);
    }
    uVar12 = uVar12 + (uint)sVar5;
    switch(uVar15) {
    case 0xb:
      uVar12 = (uint)*pbVar6 * 0x1000000 + uVar12;
    case 10:
      uVar12 = (uint)pbVar6[-1] * 0x10000 + uVar12;
    case 9:
      uVar12 = (uint)pbVar6[-2] * 0x100 + uVar12;
    case 8:
      uVar14 = (uint)pbVar6[-3] * 0x1000000 + uVar14;
    case 7:
      uVar14 = (uint)pbVar6[-4] * 0x10000 + uVar14;
    case 6:
      uVar14 = (uint)pbVar6[-5] * 0x100 + uVar14;
    case 5:
      uVar14 = pbVar6[-6] + uVar14;
    case 4:
      uVar17 = (uint)pbVar6[-7] * 0x1000000 + uVar17;
    case 3:
      uVar17 = (uint)pbVar6[-8] * 0x10000 + uVar17;
    case 2:
      uVar17 = (uint)pbVar6[-9] * 0x100 + uVar17;
    case 1:
      uVar17 = pbVar6[-10] + uVar17;
    }
    if (ctx->channels != (chirc_channel_t *)0x0) {
      uVar17 = uVar12 >> 0xd ^ (uVar17 - uVar14) - uVar12;
      uVar14 = uVar17 << 8 ^ (uVar14 - uVar12) - uVar17;
      uVar12 = uVar14 >> 0xd ^ (uVar12 - uVar17) - uVar14;
      uVar17 = uVar12 >> 0xc ^ (uVar17 - uVar14) - uVar12;
      uVar15 = uVar17 << 0x10 ^ (uVar14 - uVar12) - uVar17;
      uVar14 = uVar15 >> 5 ^ (uVar12 - uVar17) - uVar15;
      uVar17 = uVar14 >> 3 ^ (uVar17 - uVar15) - uVar14;
      uVar12 = uVar17 << 10 ^ (uVar15 - uVar14) - uVar17;
      uVar17 = uVar12 >> 0xf ^ uVar14 - (uVar17 + uVar12);
      pUVar9 = (ctx->channels->hh).tbl;
      pUVar13 = pUVar9->buckets[pUVar9->num_buckets - 1 & uVar17].hh_head;
      if (pUVar13 == (UT_hash_handle *)0x0) {
        pcVar20 = (chirc_channel_t *)0x0;
      }
      else {
        pcVar20 = (chirc_channel_t *)((long)pUVar13 - pUVar9->hho);
      }
      while (*channel = pcVar20, pcVar20 != (chirc_channel_t *)0x0) {
        if ((((pcVar20->hh).hashv == uVar17) && ((pcVar20->hh).keylen == (uint)sVar5)) &&
           (iVar4 = bcmp((pcVar20->hh).key,channelname,sVar5 & 0xffffffff), iVar4 == 0)) {
          return false;
        }
        pUVar13 = (pcVar20->hh).hh_next;
        pcVar20 = (chirc_channel_t *)0x0;
        if (pUVar13 != (UT_hash_handle *)0x0) {
          pcVar20 = (chirc_channel_t *)((long)pUVar13 - ((ctx->channels->hh).tbl)->hho);
        }
      }
    }
  }
  pcVar20 = (chirc_channel_t *)malloc(0x60);
  *channel = pcVar20;
  chirc_channel_init(pcVar20);
  pcVar7 = sdsnew(channelname);
  (*channel)->name = pcVar7;
  pcVar20 = *channel;
  pcVar7 = pcVar20->name;
  sVar8 = sdslen(pcVar7);
  pbVar6 = (byte *)(pcVar7 + 10);
  uVar14 = 0x9e3779b9;
  uVar17 = 0xfeedbeef;
  uVar12 = 0x9e3779b9;
  uVar16 = sVar8 & 0xffffffff;
  while (uVar15 = (uint)uVar16, 0xb < uVar15) {
    uVar17 = uVar17 + *(int *)(pbVar6 + -2);
    uVar18 = uVar17 >> 0xd ^
             ((uVar14 + *(int *)(pbVar6 + -10)) - (uVar12 + *(int *)(pbVar6 + -6))) - uVar17;
    uVar14 = uVar18 << 8 ^ ((uVar12 + *(int *)(pbVar6 + -6)) - uVar17) - uVar18;
    uVar12 = uVar14 >> 0xd ^ (uVar17 - uVar18) - uVar14;
    uVar17 = uVar12 >> 0xc ^ (uVar18 - uVar14) - uVar12;
    uVar18 = uVar17 << 0x10 ^ (uVar14 - uVar12) - uVar17;
    uVar19 = uVar18 >> 5 ^ (uVar12 - uVar17) - uVar18;
    uVar14 = uVar19 >> 3 ^ (uVar17 - uVar18) - uVar19;
    uVar12 = uVar14 << 10 ^ (uVar18 - uVar19) - uVar14;
    uVar17 = uVar12 >> 0xf ^ (uVar19 - uVar14) - uVar12;
    pbVar6 = pbVar6 + 0xc;
    uVar16 = (ulong)(uVar15 - 0xc);
  }
  uVar17 = uVar17 + (int)sVar8;
  switch(uVar15) {
  case 0xb:
    uVar17 = (uint)*pbVar6 * 0x1000000 + uVar17;
  case 10:
    uVar17 = (uint)pbVar6[-1] * 0x10000 + uVar17;
  case 9:
    uVar17 = (uint)pbVar6[-2] * 0x100 + uVar17;
  case 8:
    uVar12 = (uint)pbVar6[-3] * 0x1000000 + uVar12;
  case 7:
    uVar12 = (uint)pbVar6[-4] * 0x10000 + uVar12;
  case 6:
    uVar12 = (uint)pbVar6[-5] * 0x100 + uVar12;
  case 5:
    uVar12 = pbVar6[-6] + uVar12;
  case 4:
    uVar14 = (uint)pbVar6[-7] * 0x1000000 + uVar14;
  case 3:
    uVar14 = (uint)pbVar6[-8] * 0x10000 + uVar14;
  case 2:
    uVar14 = (uint)pbVar6[-9] * 0x100 + uVar14;
  case 1:
    uVar14 = pbVar6[-10] + uVar14;
  }
  uVar14 = uVar17 >> 0xd ^ (uVar14 - uVar17) - uVar12;
  uVar12 = uVar14 << 8 ^ (uVar12 - uVar17) - uVar14;
  uVar15 = uVar12 >> 0xd ^ (uVar17 - uVar14) - uVar12;
  uVar14 = uVar15 >> 0xc ^ (uVar14 - uVar12) - uVar15;
  uVar17 = uVar14 << 0x10 ^ (uVar12 - uVar15) - uVar14;
  uVar12 = uVar17 >> 5 ^ (uVar15 - uVar14) - uVar17;
  uVar14 = uVar12 >> 3 ^ (uVar14 - uVar17) - uVar12;
  uVar17 = uVar14 << 10 ^ (uVar17 - uVar12) - uVar14;
  uVar17 = uVar17 >> 0xf ^ uVar12 - (uVar14 + uVar17);
  (pcVar20->hh).hashv = uVar17;
  (pcVar20->hh).key = pcVar7;
  pcVar20 = *channel;
  sVar8 = sdslen(pcVar20->name);
  (pcVar20->hh).keylen = (uint)sVar8;
  if (ctx->channels == (chirc_channel_t *)0x0) {
    (pcVar20->hh).next = (void *)0x0;
    ((*channel)->hh).prev = (void *)0x0;
    pUVar9 = (UT_hash_table *)malloc(0x40);
    ((*channel)->hh).tbl = pUVar9;
    pUVar9 = ((*channel)->hh).tbl;
    if (pUVar9 == (UT_hash_table *)0x0) goto LAB_0010453d;
    pUVar9->ineff_expands = 0;
    pUVar9->noexpand = 0;
    *(undefined8 *)&pUVar9->signature = 0;
    pUVar9->hho = 0;
    pUVar9->ideal_chain_maxlen = 0;
    pUVar9->nonideal_items = 0;
    *(undefined8 *)&pUVar9->num_items = 0;
    pUVar9->tail = (UT_hash_handle *)0x0;
    pUVar9->buckets = (UT_hash_bucket *)0x0;
    pUVar9->num_buckets = 0;
    pUVar9->log2_num_buckets = 0;
    (((*channel)->hh).tbl)->tail = &(*channel)->hh;
    pUVar9 = ((*channel)->hh).tbl;
    pUVar9->num_buckets = 0x20;
    pUVar9->log2_num_buckets = 5;
    pUVar9->hho = 0x28;
    pUVar10 = (UT_hash_bucket *)malloc(0x200);
    pUVar9->buckets = pUVar10;
    pUVar9 = ((*channel)->hh).tbl;
    pUVar9->signature = 0xa0111fe1;
    pUVar10 = pUVar9->buckets;
    if (pUVar10 == (UT_hash_bucket *)0x0) goto LAB_0010453d;
    memset(pUVar10,0,0x200);
    pcVar20 = *channel;
    ctx->channels = pcVar20;
    pUVar9 = (pcVar20->hh).tbl;
  }
  else {
    pUVar9 = (ctx->channels->hh).tbl;
    (pcVar20->hh).tbl = pUVar9;
    ((*channel)->hh).next = (void *)0x0;
    pUVar13 = pUVar9->tail;
    ((*channel)->hh).prev = (void *)((long)pUVar13 - pUVar9->hho);
    pcVar20 = *channel;
    pUVar13->next = pcVar20;
    pUVar9->tail = &pcVar20->hh;
    pcVar20 = *channel;
  }
  pUVar9->num_items = pUVar9->num_items + 1;
  uVar17 = pUVar9->num_buckets - 1 & uVar17;
  pUVar10 = pUVar9->buckets;
  uVar12 = pUVar10[uVar17].count + 1;
  pUVar10[uVar17].count = uVar12;
  pUVar13 = pUVar10[uVar17].hh_head;
  (pcVar20->hh).hh_next = pUVar13;
  ((*channel)->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar13 != (UT_hash_handle *)0x0) {
    pUVar13->hh_prev = &(*channel)->hh;
  }
  pUVar10[uVar17].hh_head = &(*channel)->hh;
  if ((pUVar10[uVar17].expand_mult * 10 + 10 <= uVar12) &&
     (pUVar9 = ((*channel)->hh).tbl, pUVar9->noexpand == 0)) {
    uVar17 = pUVar9->num_buckets;
    uVar16 = (ulong)uVar17;
    pUVar10 = (UT_hash_bucket *)calloc(1,uVar16 << 5);
    if (pUVar10 == (UT_hash_bucket *)0x0) {
LAB_0010453d:
      exit(-1);
    }
    pUVar9->ideal_chain_maxlen =
         ((pUVar9->num_items >> ((char)pUVar9->log2_num_buckets + 1U & 0x1f)) + 1) -
         (uint)((uVar17 * 2 - 1 & pUVar9->num_items) == 0);
    pUVar9->nonideal_items = 0;
    for (uVar11 = 0; uVar11 < uVar16; uVar11 = uVar11 + 1) {
      pUVar13 = pUVar9->buckets[uVar11].hh_head;
      while (pUVar13 != (UT_hash_handle *)0x0) {
        pUVar9 = ((*channel)->hh).tbl;
        uVar12 = pUVar9->num_buckets * 2 - 1 & pUVar13->hashv;
        pUVar2 = pUVar13->hh_next;
        pUVar1 = pUVar10 + uVar12;
        uVar17 = pUVar10[uVar12].count + 1;
        pUVar10[uVar12].count = uVar17;
        if (pUVar9->ideal_chain_maxlen < uVar17) {
          pUVar9->nonideal_items = pUVar9->nonideal_items + 1;
          if (pUVar9->ideal_chain_maxlen * pUVar1->expand_mult < uVar17) {
            pUVar1->expand_mult = pUVar1->expand_mult + 1;
          }
        }
        pUVar13->hh_prev = (UT_hash_handle *)0x0;
        pUVar3 = pUVar1->hh_head;
        pUVar13->hh_next = pUVar3;
        if (pUVar3 != (UT_hash_handle *)0x0) {
          pUVar3->hh_prev = pUVar13;
        }
        pUVar1->hh_head = pUVar13;
        pUVar13 = pUVar2;
      }
      pUVar9 = ((*channel)->hh).tbl;
      uVar16 = (ulong)pUVar9->num_buckets;
    }
    free(pUVar9->buckets);
    pUVar9 = ((*channel)->hh).tbl;
    pUVar9->num_buckets = pUVar9->num_buckets << 1;
    pUVar9->log2_num_buckets = pUVar9->log2_num_buckets + 1;
    pUVar9->buckets = pUVar10;
    pUVar9 = ((*channel)->hh).tbl;
    if (pUVar9->num_items >> 1 < pUVar9->nonideal_items) {
      uVar17 = pUVar9->ineff_expands + 1;
      pUVar9->ineff_expands = uVar17;
      if (1 < uVar17) {
        pUVar9->noexpand = 1;
      }
    }
    else {
      pUVar9->ineff_expands = 0;
    }
  }
  return true;
}

Assistant:

bool chirc_ctx_get_or_create_channel(chirc_ctx_t *ctx, char *channelname, chirc_channel_t **channel)
{
    bool created;


    HASH_FIND_STR(ctx->channels, channelname, *channel);
    if(*channel)
    {
        created = false;
    }
    else
    {
        created = true;

        *channel = malloc(sizeof(chirc_channel_t));
        chirc_channel_init(*channel);
        (*channel)->name = sdsnew(channelname);
        HASH_ADD_KEYPTR(hh, ctx->channels, (*channel)->name, sdslen((*channel)->name), *channel);
    }

    return created;
}